

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void __thiscall
TTD::NSSnapValues::EmitSlotArrayInfo
          (NSSnapValues *this,SlotArrayInfo *slotInfo,FileWriter *writer,Separator separator)

{
  undefined7 in_register_00000009;
  undefined1 local_21;
  uint local_20;
  uint32 i;
  Separator separator_local;
  FileWriter *writer_local;
  SlotArrayInfo *slotInfo_local;
  
  (**(code **)(slotInfo->SlotId + 0x30))
            (slotInfo,(ulong)writer & 0xff,writer,CONCAT71(in_register_00000009,(char)writer));
  (**(code **)(slotInfo->SlotId + 0x40))(slotInfo,1);
  FileWriter::WriteAddr((FileWriter *)slotInfo,slotId,*(TTD_PTR_ID *)this,BigSpaceSeparator);
  FileWriter::WriteLogTag
            ((FileWriter *)slotInfo,ctxTag,*(TTD_LOG_PTR_ID *)(this + 8),CommaSeparator);
  (**(code **)(slotInfo->SlotId + 0x60))(slotInfo,0x4c,(byte)this[0x28] & 1,1);
  if (((byte)this[0x28] & 1) == 0) {
    (**(code **)(slotInfo->SlotId + 0x60))(slotInfo,0x19,*(long *)(this + 0x40) != 0,1);
    if (*(long *)(this + 0x40) == 0) {
      FileWriter::WriteAddr
                ((FileWriter *)slotInfo,debuggerScopeId,*(TTD_PTR_ID *)(this + 0x38),CommaSeparator)
      ;
    }
    else {
      FileWriter::WriteWellKnownToken
                ((FileWriter *)slotInfo,wellKnownToken,*(TTD_WELLKNOWN_TOKEN *)(this + 0x40),
                 CommaSeparator);
    }
  }
  else {
    FileWriter::WriteAddr
              ((FileWriter *)slotInfo,functionBodyId,*(TTD_PTR_ID *)(this + 0x30),CommaSeparator);
  }
  FileWriter::WriteLengthValue
            ((FileWriter *)slotInfo,*(uint32 *)(this + 0x10),CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey((FileWriter *)slotInfo,CommaAndBigSpaceSeparator);
  (**(code **)(slotInfo->SlotId + 0x40))(slotInfo,1);
  for (local_20 = 0; local_20 < *(uint *)(this + 0x10); local_20 = local_20 + 1) {
    local_21 = 3;
    if (local_20 == 0) {
      local_21 = 2;
    }
    (**(code **)(slotInfo->SlotId + 0x30))
              (slotInfo,local_21,2,CONCAT31((int3)(local_20 >> 8),local_21));
    FileWriter::WriteUInt32
              ((FileWriter *)slotInfo,pid,*(uint32 *)(*(long *)(this + 0x20) + (ulong)local_20 * 4),
               NoSeparator);
    (**(code **)(slotInfo->SlotId + 0x18))(slotInfo,3,1);
    EmitTTDVar(*(TTDVar *)(*(long *)(this + 0x18) + (ulong)local_20 * 8),(FileWriter *)slotInfo,
               NoSeparator);
    (**(code **)(slotInfo->SlotId + 0x38))(slotInfo,0);
  }
  (**(code **)(slotInfo->SlotId + 0x40))(slotInfo,0xffffffff);
  (**(code **)(slotInfo->SlotId + 0x28))(slotInfo,2);
  (**(code **)(slotInfo->SlotId + 0x40))(slotInfo,0xffffffff);
  (**(code **)(slotInfo->SlotId + 0x38))(slotInfo,2);
  return;
}

Assistant:

void EmitSlotArrayInfo(const SlotArrayInfo* slotInfo, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);
            writer->AdjustIndent(1);

            writer->WriteAddr(NSTokens::Key::slotId, slotInfo->SlotId, NSTokens::Separator::BigSpaceSeparator);
            writer->WriteLogTag(NSTokens::Key::ctxTag, slotInfo->ScriptContextLogId, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::isFunctionMetaData, slotInfo->isFunctionBodyMetaData, NSTokens::Separator::CommaSeparator);
            if(slotInfo->isFunctionBodyMetaData)
            {
                writer->WriteAddr(NSTokens::Key::functionBodyId, slotInfo->OptFunctionBodyId, NSTokens::Separator::CommaSeparator);
            }
            else
            {
                writer->WriteBool(NSTokens::Key::isWellKnownToken, slotInfo->OptWellKnownDbgScope != TTD_INVALID_WELLKNOWN_TOKEN, NSTokens::Separator::CommaSeparator);
                if(slotInfo->OptWellKnownDbgScope != TTD_INVALID_WELLKNOWN_TOKEN)
                {
                    writer->WriteWellKnownToken(NSTokens::Key::wellKnownToken, slotInfo->OptWellKnownDbgScope, NSTokens::Separator::CommaSeparator);
                }
                else
                {
                    writer->WriteAddr(NSTokens::Key::debuggerScopeId, slotInfo->OptDebugScopeId, NSTokens::Separator::CommaSeparator);
                }
            }

            writer->WriteLengthValue(slotInfo->SlotCount, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->AdjustIndent(1);
            for(uint32 i = 0; i < slotInfo->SlotCount; ++i)
            {
                writer->WriteRecordStart(i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator);
                writer->WriteUInt32(NSTokens::Key::pid, slotInfo->PIDArray[i], NSTokens::Separator::NoSeparator);
                writer->WriteKey(NSTokens::Key::entry, NSTokens::Separator::CommaSeparator);

                EmitTTDVar(slotInfo->Slots[i], writer, NSTokens::Separator::NoSeparator);

                writer->WriteRecordEnd();
            }
            writer->AdjustIndent(-1);
            writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);

            writer->AdjustIndent(-1);
            writer->WriteRecordEnd(NSTokens::Separator::BigSpaceSeparator);
        }